

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-proxy.c
# Opt level: O1

Socket * platform_new_connection
                   (SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                   _Bool nodelay,_Bool keepalive,Plug *plug,Conf *conf,Interactor *itr)

{
  int iVar1;
  int infd;
  DeferredSocketOpener *opener;
  Socket *pSVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  
  iVar1 = conf_get_int(conf,0xd);
  if (iVar1 == 9) {
    pcVar3 = format_telnet_command(addr,port,conf,(uint *)0x0);
    iVar1 = open("/dev/null",1);
    if (iVar1 == -1) {
      safefree(pcVar3);
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      pSVar2 = new_error_socket_fmt(plug,"/dev/null: %s",pcVar3);
      return pSVar2;
    }
    infd = open(pcVar3,0);
    if (infd != -1) {
      safefree(pcVar3);
      pSVar2 = make_fd_socket(infd,iVar1,-1,addr,port,plug);
      return pSVar2;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    pSVar2 = new_error_socket_fmt(plug,"%s: %s",pcVar3,pcVar5);
    safefree(pcVar3);
    close(iVar1);
  }
  else if (iVar1 == 5) {
    opener = local_proxy_opener(addr,port,plug,conf,itr);
    pSVar2 = make_deferred_fd_socket(opener,addr,port,plug);
    local_proxy_opener_set_socket(opener,pSVar2);
  }
  else {
    pSVar2 = (Socket *)0x0;
  }
  return pSVar2;
}

Assistant:

Socket *platform_new_connection(SockAddr *addr, const char *hostname,
                                int port, bool privport,
                                bool oobinline, bool nodelay, bool keepalive,
                                Plug *plug, Conf *conf, Interactor *itr)
{
    switch (conf_get_int(conf, CONF_proxy_type)) {
      case PROXY_CMD: {
        DeferredSocketOpener *opener = local_proxy_opener(
            addr, port, plug, conf, itr);
        Socket *socket = make_deferred_fd_socket(opener, addr, port, plug);
        local_proxy_opener_set_socket(opener, socket);
        return socket;
      }

      case PROXY_FUZZ: {
        char *cmd = format_telnet_command(addr, port, conf, NULL);
        int outfd = open("/dev/null", O_WRONLY);
        if (outfd == -1) {
            sfree(cmd);
            return new_error_socket_fmt(
                plug, "/dev/null: %s", strerror(errno));
        }
        int infd = open(cmd, O_RDONLY);
        if (infd == -1) {
            Socket *toret = new_error_socket_fmt(
                plug, "%s: %s", cmd, strerror(errno));
            sfree(cmd);
            close(outfd);
            return toret;
        }
        sfree(cmd);
        return make_fd_socket(infd, outfd, -1, addr, port, plug);
      }

      default:
        return NULL;
    }
}